

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O2

void QLibraryStore::releaseLibrary(QLibraryPrivate *lib)

{
  QAtomicInt *pQVar1;
  map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
  *c;
  long in_FS_OFFSET;
  undefined1 local_20 [16];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._0_8_ = &qt_library_mutex;
  QBasicMutex::lock(&qt_library_mutex);
  local_20[8] = true;
  c = &instance()->libraryMap;
  LOCK();
  pQVar1 = &lib->libraryRefCount;
  (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i != 0) goto LAB_004377cf;
  if (c == (map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
            *)0x0) {
    if (lib != (QLibraryPrivate *)0x0) goto LAB_004377ba;
  }
  else {
    if ((lib->fileName).d.size != 0) {
      q20::
      erase_if<QString,QLibraryPrivate*,std::less<QString>,QLibraryStore::releaseLibrary(QLibraryPrivate*)::_lambda(auto:1_const&)_1_>
                (c,(anon_class_8_1_ba1d5de5)lib);
    }
LAB_004377ba:
    QLibraryPrivate::~QLibraryPrivate(lib);
  }
  operator_delete(lib,0xb0);
LAB_004377cf:
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QLibraryStore::releaseLibrary(QLibraryPrivate *lib)
{
    QMutexLocker locker(&qt_library_mutex);
    QLibraryStore *data = instance();

    if (lib->libraryRefCount.deref()) {
        // still in use
        return;
    }

    // no one else is using
    Q_ASSERT(lib->libraryUnloadCount.loadRelaxed() == 0);

    if (Q_LIKELY(data) && !lib->fileName.isEmpty()) {
        using q20::erase_if;
        const auto n = erase_if(data->libraryMap, [lib](const auto &e) {
            return e.second == lib;
        });
        Q_ASSERT_X(n, "~QLibrary", "Did not find this library in the library map");
        Q_UNUSED(n);
    }
    delete lib;
}